

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_StArrGeneric<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  JavascriptArrayBuffer *pJVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 *puVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined1 uVar10;
  undefined2 uVar11;
  undefined4 uVar12;
  undefined4 extraout_var;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x23a3,"((0))","UNREACHED");
    if (bVar4) {
      *puVar9 = 0;
      return;
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  uVar1 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  switch(playout->ViewType) {
  default:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar5 <= uVar1) {
      return;
    }
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    lVar7 = CONCAT44(extraout_var,iVar6);
    uVar10 = *(undefined1 *)(*(long *)(this + 0x118) + (ulong)uVar2 * 4);
    goto LAB_00a753a7;
  case TYPE_INT16:
  case TYPE_UINT16:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar5 <= (uVar1 & 0xfffffffe)) {
      return;
    }
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    lVar7 = CONCAT44(extraout_var_02,iVar6);
    uVar11 = *(undefined2 *)(*(long *)(this + 0x118) + (ulong)uVar2 * 4);
    goto LAB_00a7531a;
  case TYPE_INT32:
  case TYPE_UINT32:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar5 <= (uVar1 & 0xfffffffc)) {
      return;
    }
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    lVar7 = CONCAT44(extraout_var_01,iVar6);
    uVar12 = *(undefined4 *)(*(long *)(this + 0x118) + (ulong)uVar2 * 4);
    goto LAB_00a75363;
  case TYPE_FLOAT32:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar1 & 0xfffffffc) < uVar5) {
      iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
      *(undefined4 *)(CONCAT44(extraout_var_06,iVar6) + (ulong)(uVar1 & 0xfffffffc)) =
           *(undefined4 *)(*(long *)(this + 0x130) + (ulong)uVar2 * 4);
    }
    break;
  case TYPE_FLOAT64:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar1 & 0xfffffff8) < uVar5) {
      iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
      *(undefined8 *)(CONCAT44(extraout_var_05,iVar6) + (ulong)(uVar1 & 0xfffffff8)) =
           *(undefined8 *)(*(long *)(this + 0x128) + (ulong)uVar2 * 8);
    }
    break;
  case TYPE_INT64:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if ((uVar1 & 0xfffffff8) < uVar5) {
      iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
      *(undefined8 *)(CONCAT44(extraout_var_07,iVar6) + (ulong)(uVar1 & 0xfffffff8)) =
           *(undefined8 *)(*(long *)(this + 0x120) + (ulong)uVar2 * 8);
    }
    break;
  case TYPE_INT8_TO_INT64:
  case TYPE_UINT8_TO_INT64:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar5 <= uVar1) {
      return;
    }
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    lVar7 = CONCAT44(extraout_var_04,iVar6);
    uVar10 = *(undefined1 *)(*(long *)(this + 0x120) + (ulong)uVar2 * 8);
LAB_00a753a7:
    *(undefined1 *)(lVar7 + (ulong)uVar1) = uVar10;
    break;
  case TYPE_INT16_TO_INT64:
  case TYPE_UINT16_TO_INT64:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar5 <= (uVar1 & 0xfffffffe)) {
      return;
    }
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    lVar7 = CONCAT44(extraout_var_00,iVar6);
    uVar11 = *(undefined2 *)(*(long *)(this + 0x120) + (ulong)uVar2 * 8);
LAB_00a7531a:
    *(undefined2 *)(lVar7 + (ulong)(uVar1 & 0xfffffffe)) = uVar11;
    break;
  case TYPE_INT32_TO_INT64:
  case TYPE_UINT32_TO_INT64:
    uVar2 = playout->Value;
    pJVar8 = GetAsmJsBuffer(this);
    uVar5 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar8);
    if (uVar5 <= (uVar1 & 0xfffffffc)) {
      return;
    }
    iVar6 = (*(pJVar8->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar8);
    lVar7 = CONCAT44(extraout_var_03,iVar6);
    uVar12 = *(undefined4 *)(*(long *)(this + 0x120) + (ulong)uVar2 * 8);
LAB_00a75363:
    *(undefined4 *)(lVar7 + (ulong)(uVar1 & 0xfffffffc)) = uVar12;
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_StArrGeneric(const unaligned T* playout)
    {
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_StArr<MemType, RegType>(index & ARRAYBUFFER_VIEW_MASK(align), playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }